

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_string.c
# Opt level: O3

void test_cio_memmem(void)

{
  void *pvVar1;
  size_t needlelen;
  char needle_not_found [2];
  char needle_found [2];
  char haystack [5];
  char local_1c [2];
  undefined2 local_1a;
  undefined4 local_18;
  undefined1 local_14;
  
  local_14 = 0;
  local_18 = 0x64636261;
  local_1a = 0x61;
  pvVar1 = cio_memmem(&local_18,5,&local_1a,1);
  UnityAssertEqualNumber
            ((UNITY_INT)pvVar1,(UNITY_INT)&local_18,"Needle was not found in haystack!",0x34,
             UNITY_DISPLAY_STYLE_INT);
  local_1c[0] = 'e';
  local_1c[1] = '\0';
  needlelen = strlen(local_1c);
  pvVar1 = cio_memmem(&local_18,5,local_1c,needlelen);
  UnityAssertEqualNumber
            (0,(UNITY_INT)pvVar1,"Needle was found in haystack!",0x38,UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_cio_memmem(void)
{
	const char haystack[] = "abcd";
	const char needle_found[] = "a";

	const void *found = cio_memmem(haystack, sizeof(haystack), needle_found, strlen(needle_found));
	TEST_ASSERT_EQUAL_MESSAGE(found, haystack, "Needle was not found in haystack!");

	char needle_not_found[] = "e";
	found = cio_memmem(haystack, sizeof(haystack), needle_not_found, strlen(needle_not_found));
	TEST_ASSERT_EQUAL_MESSAGE(NULL, found, "Needle was found in haystack!");
}